

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::SetAllocated
          (ArenaStringPtr *this,string *value,Arena *arena)

{
  string *str;
  
  Destroy(this);
  if (value != (string *)0x0) {
    str = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)str,(string *)value);
    std::__cxx11::string::~string((string *)value);
    operator_delete(value,0x20);
    InitAllocated(this,str,arena);
    return;
  }
  (this->tagged_ptr_).ptr_ = &fixed_address_empty_string;
  return;
}

Assistant:

void ArenaStringPtr::SetAllocated(std::string* value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  // Release what we have first.
  Destroy();

  if (value == nullptr) {
    InitDefault();
  } else {
#ifndef NDEBUG
    // On debug builds, copy the string so the address differs.  delete will
    // fail if value was a stack-allocated temporary/etc., which would have
    // failed when arena ran its cleanup list.
    std::string* new_value = new std::string(std::move(*value));
    delete value;
    value = new_value;
#endif  // !NDEBUG
    InitAllocated(value, arena);
  }
}